

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.cpp
# Opt level: O2

int linenoiseHistorySave(char *filename)

{
  __mode_t __mask;
  int iVar1;
  int j;
  long lVar2;
  allocator<char> local_51;
  File file;
  char *local_40 [4];
  
  __mask = umask(0x7f);
  file.file = (FILE *)0x0;
  file.fd = -1;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_40,filename,&local_51);
  file.file = (FILE *)fopen(local_40[0],"w");
  std::__cxx11::string::~string((string *)local_40);
  umask(__mask);
  if (file.file == (FILE *)0x0) {
    iVar1 = -1;
  }
  else {
    chmod(filename,0x180);
    iVar1 = 0;
    for (lVar2 = 0; lVar2 < history_len; lVar2 = lVar2 + 1) {
      fprintf((FILE *)file.file,"%s\n",history[lVar2]);
    }
  }
  File::~File(&file);
  return iVar1;
}

Assistant:

int linenoiseHistorySave(const char *filename) {
    mode_t old_umask = umask(S_IXUSR|S_IRWXG|S_IRWXO);
    File   file;
    file.open(filename, "w");
    umask(old_umask);
    if (file.file == NULL) {
        return -1;
    }
    chmod(filename,S_IRUSR|S_IWUSR);
    for (int j = 0; j < history_len; ++j) {
        fprintf(file.file, "%s\n", history[j]);
    }

    return 0;
}